

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusproxy.cpp
# Opt level: O0

QIBusEngineDesc * __thiscall QIBusProxy::getGlobalEngine(QIBusProxy *this)

{
  bool bVar1;
  QVariant *in_RSI;
  QIBusEngineDesc *in_RDI;
  long in_FS_OFFSET;
  QIBusEngineDesc *desc;
  QDBusArgument argument;
  QVariant child;
  QVariant variant;
  QDBusReply<QDBusVariant> reply;
  QIBusEngineDesc *this_00;
  QDBusArgument local_f8;
  QDBusPendingCall local_f0 [40];
  anon_union_24_3_e3d07ef4_for_data local_c8;
  undefined8 local_b0;
  anon_union_24_3_e3d07ef4_for_data local_88;
  undefined8 local_70;
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  memset(in_RDI,0xaa,0x1a8);
  QIBusEngineDesc::QIBusEngineDesc(this_00);
  memset(local_68,0xaa,0x60);
  GlobalEngine((QIBusProxy *)in_RSI);
  QDBusReply<QDBusVariant>::QDBusReply
            ((QDBusReply<QDBusVariant> *)this_00,(QDBusPendingCall *)in_RDI);
  QDBusPendingCall::~QDBusPendingCall(local_f0);
  local_88.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_88._8_8_ = 0xaaaaaaaaaaaaaaaa;
  local_88._16_8_ = 0xaaaaaaaaaaaaaaaa;
  local_70 = 0xaaaaaaaaaaaaaaaa;
  QDBusReply<QDBusVariant>::value((QDBusReply<QDBusVariant> *)in_RDI);
  QDBusVariant::variant((QDBusVariant *)in_RDI);
  QDBusVariant::~QDBusVariant((QDBusVariant *)0x12c80f);
  bVar1 = QVariant::isValid((QVariant *)this_00);
  if (bVar1) {
    local_c8.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
    local_c8._8_8_ = 0xaaaaaaaaaaaaaaaa;
    local_c8._16_8_ = 0xaaaaaaaaaaaaaaaa;
    local_b0 = 0xaaaaaaaaaaaaaaaa;
    qvariant_cast<QDBusVariant>(in_RSI);
    QDBusVariant::variant((QDBusVariant *)in_RDI);
    QDBusVariant::~QDBusVariant((QDBusVariant *)0x12c88d);
    bVar1 = QVariant::isValid((QVariant *)this_00);
    if (bVar1) {
      local_f8.d = (QDBusArgumentPrivate *)0xaaaaaaaaaaaaaaaa;
      qvariant_cast<QDBusArgument>(in_RSI);
      operator>>((QDBusArgument *)this_00,in_RDI);
      QDBusArgument::~QDBusArgument(&local_f8);
    }
    QVariant::~QVariant((QVariant *)&local_c8);
  }
  QVariant::~QVariant((QVariant *)&local_88);
  QDBusReply<QDBusVariant>::~QDBusReply((QDBusReply<QDBusVariant> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QIBusEngineDesc QIBusProxy::getGlobalEngine()
{
    QIBusEngineDesc desc;
    QDBusReply<QDBusVariant> reply = GlobalEngine();
    QVariant variant = reply.value().variant();
    if (!variant.isValid())
        return desc;
    QVariant child = qvariant_cast<QDBusVariant>(variant).variant();
    if (!child.isValid())
        return desc;
    const QDBusArgument argument = qvariant_cast<QDBusArgument>(child);
    argument >> desc;
    return desc;
}